

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O1

PaError PaUnixMutex_Lock(PaUnixMutex *self)

{
  PaError PVar1;
  
  paUtilErr_ = pthread_mutex_lock((pthread_mutex_t *)self);
  PVar1 = 0;
  if (paUtilErr_ != 0) {
    PaUnixMutex_Lock_cold_1();
    PVar1 = -9999;
  }
  return PVar1;
}

Assistant:

PaError PaUnixMutex_Lock( PaUnixMutex* self )
{
    PaError result = paNoError;

#ifdef PTHREAD_CANCEL
    int oldState;
    PA_ENSURE_SYSTEM( pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, &oldState ), 0 );
#endif
    PA_ENSURE_SYSTEM( pthread_mutex_lock( &self->mtx ), 0 );

error:
    return result;
}